

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O2

void __thiscall QToolBoxPrivate::_q_widgetDestroyed(QToolBoxPrivate *this,QObject *object)

{
  QToolBox *this_00;
  Page *pPVar1;
  Page *pPVar2;
  __uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *p_Var3;
  const_iterator __first;
  long lVar4;
  long lVar5;
  const_iterator __last;
  
  this_00 = *(QToolBox **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  pPVar2 = page(this,object);
  if (pPVar2 == (Page *)0x0) {
    return;
  }
  QLayout::removeWidget((QLayout *)this->layout,(QWidget *)pPVar2->sv);
  QLayout::removeWidget((QLayout *)this->layout,(QWidget *)pPVar2->button);
  QObject::deleteLater();
  if (pPVar2->button != (QToolBoxButton *)0x0) {
    (**(code **)(*(long *)&(pPVar2->button->super_QAbstractButton).super_QWidget + 0x20))();
  }
  pPVar1 = this->currentPage;
  p_Var3 = (__uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
           (this->pageList).
           super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->pageList).
       super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)__last._M_current - (long)p_Var3;
  for (lVar5 = lVar4 >> 5; 0 < lVar5; lVar5 = lVar5 + -1) {
    __first._M_current =
         (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)p_Var3;
    if ((p_Var3->_M_t).
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar2)
    goto LAB_004761f9;
    if (p_Var3[1]._M_t.
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar2) {
      __first._M_current =
           (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
           (p_Var3 + 1);
      goto LAB_004761f9;
    }
    if (p_Var3[2]._M_t.
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar2) {
      __first._M_current =
           (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
           (p_Var3 + 2);
      goto LAB_004761f9;
    }
    if (p_Var3[3]._M_t.
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar2) {
      __first._M_current =
           (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
           (p_Var3 + 3);
      goto LAB_004761f9;
    }
    p_Var3 = p_Var3 + 4;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 == 1) {
LAB_004761e0:
    __first._M_current =
         (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)p_Var3;
    if ((p_Var3->_M_t).
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl != pPVar2) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar4 == 2) {
LAB_004761d7:
    __first._M_current =
         (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)p_Var3;
    if ((p_Var3->_M_t).
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl != pPVar2) {
      p_Var3 = p_Var3 + 1;
      goto LAB_004761e0;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar4 != 3) goto LAB_00476254;
    __first._M_current =
         (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)p_Var3;
    if ((p_Var3->_M_t).
        super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl != pPVar2) {
      p_Var3 = p_Var3 + 1;
      goto LAB_004761d7;
    }
  }
LAB_004761f9:
  p_Var3 = (__uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
           __first._M_current;
  if (__first._M_current != __last._M_current) {
    while (__first._M_current =
                (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
                ((__uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                  *)__first._M_current + 1), __first._M_current != __last._M_current) {
      if ((((__uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
           __first._M_current)->_M_t).
          super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
          .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl != pPVar2) {
        std::__uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>::
        operator=(p_Var3,(__uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                          *)__first._M_current);
        p_Var3 = p_Var3 + 1;
      }
    }
    __last._M_current =
         (this->pageList).
         super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __first._M_current =
         (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)p_Var3;
  }
LAB_00476254:
  std::
  vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
  ::erase(&this->pageList,__first,__last);
  if ((this->pageList).
      super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->pageList).
      super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this->currentPage = (Page *)0x0;
    QToolBox::currentChanged(this_00,-1);
    return;
  }
  if (pPVar2 != pPVar1) {
    return;
  }
  this->currentPage = (Page *)0x0;
  QToolBox::setCurrentIndex(this_00,0);
  return;
}

Assistant:

void QToolBoxPrivate::_q_widgetDestroyed(QObject *object)
{
    Q_Q(QToolBox);

    const QToolBoxPrivate::Page * const c = page(object);
    if (!c)
        return;

    layout->removeWidget(c->sv);
    layout->removeWidget(c->button);
    c->sv->deleteLater(); // page might still be a child of sv
    delete c->button;

    bool removeCurrent = c == currentPage;
    pageList.erase(std::remove_if(pageList.begin(), pageList.end(), pageEquals(c)), pageList.end());

    if (pageList.empty()) {
        currentPage = nullptr;
        emit q->currentChanged(-1);
    } else if (removeCurrent) {
        currentPage = nullptr;
        q->setCurrentIndex(0);
    }
}